

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_st_seg.c
# Opt level: O3

int agg_st_seg(model_def_t *mdef,lexicon_t *lex,feat_t *fcb,uint32 *ts2cb,int32 *cb2mllr,
              segdmp_type_t type)

{
  float32 ***pppfVar1;
  float32 **ppfVar2;
  mfcc_t **ppmVar3;
  float32 *pfVar4;
  mfcc_t *pmVar5;
  float32 **ppfVar6;
  uint32 uVar7;
  int iVar8;
  cmd_ln_t *cmdln;
  uint32 *ptr;
  char *pcVar9;
  void *ptr_00;
  ulong uVar10;
  uint32 *puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t n_elem;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  vector_t *mfcc;
  uint32 n_mllr_cls;
  int32 n_frame;
  float32 ****a;
  int32 n_frame_1;
  float32 ***b;
  uint16 *seg;
  char *trans;
  uint32 n_stream_tmp;
  acmod_id_t *phone;
  uint32 *veclen_tmp;
  uint local_d4;
  vector_t *local_d0;
  uint local_c8;
  uint local_c4;
  mfcc_t ***local_c0;
  uint local_b4;
  float32 ****local_b0;
  uint local_a4;
  uint32 *local_a0;
  float32 ***local_98;
  uint32 *local_90;
  uint16 *local_88;
  char *local_80;
  uint local_78;
  uint32 local_74;
  acmod_id_t *local_70;
  model_def_t *local_68;
  feat_t *local_60;
  lexicon_t *local_58;
  long local_50;
  uint32 *local_48;
  int32 *local_40;
  uint32 *local_38;
  
  local_d0 = (vector_t *)0x0;
  local_b0 = (float32 ****)0x0;
  local_98 = (float32 ***)0x0;
  local_58 = lex;
  local_48 = ts2cb;
  local_40 = cb2mllr;
  cmdln = cmd_ln_get();
  local_50 = cmd_ln_int_r(cmdln,"-ceplen");
  local_d4 = fcb->n_sv;
  if (local_d4 == 0) {
    local_d4 = fcb->n_stream;
  }
  if (fcb->lda == (mfcc_t ***)0x0) {
    puVar11 = fcb->sv_len;
    if (puVar11 == (uint32 *)0x0) {
      puVar11 = fcb->stream_len;
    }
  }
  else {
    puVar11 = &fcb->out_dim;
  }
  uVar7 = corpus_get_begin();
  iVar8 = corpus_next_utt();
  if (iVar8 == 0) {
    ptr = (uint32 *)0x0;
    local_c0 = (mfcc_t ***)0x0;
  }
  else {
    uVar13 = (ulong)local_d4;
    local_c0 = (mfcc_t ***)0x0;
    ptr = (uint32 *)0x0;
    local_90 = puVar11;
    local_68 = mdef;
    local_60 = fcb;
    do {
      if ((uVar7 * 0x26e978d5 >> 1 | (uint)((uVar7 * 0x26e978d5 & 1) != 0) << 0x1f) < 0x10624de) {
        err_msg(ERR_INFOCONT,(char *)0x0,0," [%u]",(ulong)uVar7);
      }
      if (local_d0 != (vector_t *)0x0) {
        free(*local_d0);
        ckd_free(local_d0);
        local_d0 = (vector_t *)0x0;
      }
      iVar8 = corpus_get_generic_featurevec(&local_d0,(int32 *)&local_c4,(uint32)local_50);
      if (iVar8 < 0) {
        pcVar9 = corpus_utt();
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                ,0xad,"Can\'t read input features from %s\n",pcVar9);
LAB_0010490b:
        exit(1);
      }
      local_b4 = uVar7;
      if (ptr != (uint32 *)0x0) {
        ckd_free(ptr);
      }
      uVar16 = local_c4;
      corpus_get_sent(&local_80);
      corpus_get_seg(&local_88,(int32 *)&local_a4);
      if (local_a4 == uVar16) {
        mk_phone_seq(&local_70,&local_74,local_80,mdef->acmod_set,local_58);
        ptr = mk_sseq(local_88,local_a4,local_70,local_74,mdef);
        ckd_free(local_70);
        ckd_free(local_88);
        ckd_free(local_80);
        uVar16 = local_b4;
        if (ptr == (uint32 *)0x0) goto LAB_0010456e;
        if (local_c0 != (mfcc_t ***)0x0) {
          feat_array_free(local_c0);
        }
        if ((int)local_c4 < 9) {
          pcVar9 = corpus_utt();
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                  ,200,"utt %s too short\n",pcVar9);
          if (local_d0 != (vector_t *)0x0) {
            ckd_free(*local_d0);
            ckd_free(local_d0);
            local_d0 = (vector_t *)0x0;
          }
          local_c0 = (mfcc_t ***)0x0;
        }
        else {
          local_a0 = ptr;
          local_c0 = feat_array_alloc(fcb,local_c4 + fcb->window_size);
          feat_s2mfc2feat_live(fcb,(mfcc_t **)local_d0,(int32 *)&local_c4,1,1,local_c0);
          iVar8 = corpus_has_xfrm();
          if (iVar8 != 0) {
            if (local_b0 != (float32 ****)0x0) {
              if (local_c8 != 0) {
                uVar12 = 0;
                uVar16 = local_c8;
                do {
                  if (local_d4 != 0) {
                    uVar17 = 0;
                    do {
                      ckd_free_2d(local_b0[uVar12][uVar17]);
                      uVar17 = uVar17 + 1;
                      uVar16 = local_c8;
                    } while (uVar13 != uVar17);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 < uVar16);
              }
              ckd_free_2d(local_b0);
            }
            if (local_c8 != 0 && local_98 != (float32 ***)0x0) {
              uVar12 = 0;
              uVar16 = local_c8;
              do {
                if (local_d4 != 0) {
                  uVar17 = 0;
                  do {
                    ckd_free(local_98[uVar12][uVar17]);
                    uVar17 = uVar17 + 1;
                    uVar16 = local_c8;
                  } while (uVar13 != uVar17);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < uVar16);
            }
            corpus_get_xfrm(&local_b0,&local_98,&local_38,&local_c8,&local_78);
            if (local_d4 != local_78) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                      ,0xec,"Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
                      (ulong)local_d4);
              goto LAB_0010490b;
            }
            if (local_c8 != 0) {
              uVar12 = 0;
              uVar16 = local_c8;
              do {
                puVar11 = local_90;
                if (local_d4 != 0) {
                  uVar17 = 0;
                  do {
                    invert(local_b0[uVar12][uVar17],local_b0[uVar12][uVar17],puVar11[uVar17]);
                    uVar17 = uVar17 + 1;
                    uVar16 = local_c8;
                  } while (uVar13 != uVar17);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < uVar16);
            }
          }
          ptr = local_a0;
          uVar16 = local_b4;
          if (local_c4 != 0) {
            uVar12 = 0;
            do {
              iVar8 = corpus_has_xfrm();
              if ((iVar8 != 0) && (local_d4 != 0)) {
                pppfVar1 = local_b0[(uint)local_40[local_48[local_a0[uVar12]]]];
                ppfVar2 = local_98[(uint)local_40[local_48[local_a0[uVar12]]]];
                ppmVar3 = local_c0[uVar12];
                uVar17 = 0;
                do {
                  n_elem = (size_t)local_90[uVar17];
                  if (n_elem == 0) {
                    n_elem = 0;
                  }
                  else {
                    pfVar4 = ppfVar2[uVar17];
                    pmVar5 = ppmVar3[uVar17];
                    uVar10 = 0;
                    do {
                      pmVar5[uVar10] = (mfcc_t)((float)pmVar5[uVar10] - (float)pfVar4[uVar10]);
                      uVar10 = uVar10 + 1;
                    } while (n_elem != uVar10);
                  }
                  ptr_00 = __ckd_calloc__(n_elem,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                                          ,0x4b);
                  uVar10 = (ulong)local_90[uVar17];
                  if (uVar10 != 0) {
                    ppfVar6 = pppfVar1[uVar17];
                    pmVar5 = ppmVar3[uVar17];
                    uVar14 = 0;
                    do {
                      pfVar4 = ppfVar6[uVar14];
                      fVar18 = *(float *)((long)ptr_00 + uVar14 * 4);
                      uVar15 = 0;
                      do {
                        fVar18 = fVar18 + (float)pfVar4[uVar15] * (float)pmVar5[uVar15];
                        *(float *)((long)ptr_00 + uVar14 * 4) = fVar18;
                        uVar15 = uVar15 + 1;
                      } while (uVar10 != uVar15);
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != uVar10);
                    uVar14 = 0;
                    do {
                      pmVar5[uVar14] = *(mfcc_t *)((long)ptr_00 + uVar14 * 4);
                      uVar14 = uVar14 + 1;
                    } while (uVar10 != uVar14);
                  }
                  ckd_free(ptr_00);
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar13);
              }
              segdmp_add_feat(local_a0[uVar12],(vector_t **)(local_c0 + uVar12),1);
              uVar12 = uVar12 + 1;
              ptr = local_a0;
              mdef = local_68;
              fcb = local_60;
              uVar16 = local_b4;
            } while (uVar12 < local_c4);
          }
        }
      }
      else {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                ,0x6d,"# frames in feature stream, %u != # frames in seg file %u; skipping\n",
                (ulong)uVar16);
        ckd_free(local_88);
        ckd_free(local_80);
LAB_0010456e:
        uVar16 = local_b4;
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                ,0xb9,"senone sequence not produced; skipping.\n");
        free(*local_d0);
        ckd_free(local_d0);
        feat_array_free(local_c0);
        ptr = (uint32 *)0x0;
      }
      uVar7 = uVar16 + 1;
      iVar8 = corpus_next_utt();
    } while (iVar8 != 0);
  }
  if (local_d0 != (vector_t *)0x0) {
    free(*local_d0);
    ckd_free(local_d0);
    local_d0 = (vector_t *)0x0;
  }
  if (local_c0 != (mfcc_t ***)0x0) {
    feat_array_free(local_c0);
  }
  if (ptr != (uint32 *)0x0) {
    ckd_free(ptr);
  }
  return 0;
}

Assistant:

int
agg_st_seg(model_def_t *mdef,
	   lexicon_t *lex,
	   feat_t* fcb,
	   uint32 *ts2cb,
	   int32 *cb2mllr,
	   segdmp_type_t type)
{
    uint32 seq_no;
    vector_t *mfcc = NULL;
    int32 n_frame;
    vector_t **feat = NULL;
    uint32 *sseq = NULL;
    uint32 i, j;
    uint32 t;
    uint32 n_stream=0;
    uint32 n_stream_tmp;
    uint32 *veclen = NULL;
    uint32 *veclen_tmp;
    uint32 n_mllr_cls;
    float32 ****a = NULL;
    float32 ***b = NULL;
    uint32 mcls;
    int32 mfc_veclen = cmd_ln_int32("-ceplen");

    n_stream = feat_dimension1(fcb);
    veclen = feat_stream_lengths(fcb);


    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" [%u]", seq_no);
	}
	
	    if (mfcc) {
		free(mfcc[0]);
		ckd_free(mfcc);

		mfcc = NULL;
	    }

	    if (corpus_get_generic_featurevec(&mfcc, &n_frame, mfc_veclen) < 0) {
	      E_FATAL("Can't read input features from %s\n", corpus_utt());
	    }


	if (sseq != NULL) {
	    ckd_free((void *)sseq);
	    sseq = NULL;
	}

	/* read transcript and convert it into a senone sequence */
	sseq = get_sseq(mdef, lex, n_frame);
	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    free(mfcc[0]);
	    ckd_free((void *)mfcc);
	    feat_array_free(feat);

	    continue;
	}
	
	    if (feat) {
		feat_array_free(feat);
		feat = NULL;
	    }

	    if (n_frame < 9) {
	      E_WARN("utt %s too short\n", corpus_utt());
	      if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	      }
	      continue;
	    }

	    feat = feat_array_alloc(fcb, n_frame + feat_window_size(fcb));
	    feat_s2mfc2feat_live(fcb, mfcc, &n_frame, TRUE, TRUE, feat);

	    if (corpus_has_xfrm()) {
		if (a) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free_2d((void **)a[i][j]);
			}
		    }
		    ckd_free_2d((void **)a);
		}
		if (b) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free((void *)b[i][j]);
			}
		    }
		}

		corpus_get_xfrm(&a, &b,
				&veclen_tmp,
				&n_mllr_cls,
				&n_stream_tmp);

		if (n_stream != n_stream_tmp) {
		    E_FATAL("Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
			    n_stream, n_stream_tmp);
		}

		for (i = 0; i < n_mllr_cls; i++) {
		    for (j = 0; j < n_stream; j++) {
			invert(a[i][j], a[i][j], veclen[j]);
		    }
		}
	    }

	    for (t = 0; t < n_frame; t++) {
		if (corpus_has_xfrm()) {
		    /* determine the MLLR class for the frame */
		    mcls = cb2mllr[ts2cb[sseq[t]]];

		    /* Transform the feature space using the inverse MLLR transform */
		    xfrm_feat(a[mcls], b[mcls], feat[t], n_stream, veclen);
		}
		segdmp_add_feat(sseq[t], &feat[t], 1);
	    }
    }
    
    if (mfcc) {
	free(mfcc[0]);
	ckd_free(mfcc);
	
	mfcc = NULL;
    }

    if (feat) {
	feat_array_free(feat);
	feat = NULL;
    }

    if (sseq) {
	ckd_free((void *)sseq);
	sseq = NULL;
    }

    return S3_SUCCESS;
}